

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.h
# Opt level: O2

void __thiscall
HashCallback<unsigned_int>::operator()(HashCallback<unsigned_int> *this,void *key,int len)

{
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  undefined8 in_RAX;
  uint h;
  uint local_24;
  
  local_24 = (uint)((ulong)in_RAX >> 0x20);
  this_00 = this->m_hashes;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (this_00,((long)(this_00->
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                            .super__Vector_impl_data._M_finish -
                      (long)(this_00->
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                            .super__Vector_impl_data._M_start >> 2) + 1);
  (*this->m_pfHash)(key,len,0,&local_24);
  (this->m_hashes->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_finish[-1] = local_24;
  return;
}

Assistant:

virtual void operator () ( const void * key, int len )
  {
    size_t newsize = m_hashes.size() + 1;

    m_hashes.resize(newsize);

    hashtype h;
    m_pfHash(key, len, 0, &h);

    m_hashes.back() = h;
  }